

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int model_based_tx_search_prune(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int64_t ref_best_rd)

{
  int iVar1;
  long in_RCX;
  MACROBLOCKD *unaff_RBX;
  long in_RSI;
  long in_RDI;
  MACROBLOCK *unaff_retaddr;
  BLOCK_SIZE in_stack_0000000f;
  AV1_COMP *in_stack_00000010;
  int *in_stack_00000020;
  int64_t *in_stack_00000028;
  uint8_t *in_stack_00000030;
  int64_t *in_stack_00000038;
  int factor;
  int64_t model_rd;
  MACROBLOCKD *xd;
  int64_t *in_stack_00000050;
  uint8_t model_skip;
  int64_t model_dist;
  int model_rate;
  int level;
  char local_41;
  long local_40;
  int local_38;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  uint uVar2;
  
  iVar1 = *(int *)(in_RDI + 0x60c08);
  model_rd_for_sb_with_curvfit
            (in_stack_00000010,in_stack_0000000f,unaff_retaddr,unaff_RBX,in_stack_fffffffffffffff4,
             in_stack_fffffffffffffff0,in_stack_00000020,in_stack_00000028,in_stack_00000030,
             in_stack_00000038,(int *)model_rd,(int64_t *)xd,in_stack_00000050);
  if (local_41 == '\0') {
    uVar2 = (uint)(in_RCX < (((long)local_38 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                            local_40 * 0x80) *
                            (long)model_based_tx_search_prune::prune_factor_by8[iVar1 + -1] >> 3);
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static inline int model_based_tx_search_prune(const AV1_COMP *cpi,
                                              MACROBLOCK *x, BLOCK_SIZE bsize,
                                              int64_t ref_best_rd) {
  const int level = cpi->sf.tx_sf.model_based_prune_tx_search_level;
  assert(level >= 0 && level <= 2);
  int model_rate;
  int64_t model_dist;
  uint8_t model_skip;
  MACROBLOCKD *const xd = &x->e_mbd;
  model_rd_sb_fn[MODELRD_TYPE_TX_SEARCH_PRUNE](
      cpi, bsize, x, xd, 0, 0, &model_rate, &model_dist, &model_skip, NULL,
      NULL, NULL, NULL);
  if (model_skip) return 0;
  const int64_t model_rd = RDCOST(x->rdmult, model_rate, model_dist);
  // TODO(debargha, urvang): Improve the model and make the check below
  // tighter.
  static const int prune_factor_by8[] = { 3, 5 };
  const int factor = prune_factor_by8[level - 1];
  return ((model_rd * factor) >> 3) > ref_best_rd;
}